

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall cmCTestRunProcess::cmCTestRunProcess(cmCTestRunProcess *this)

{
  cmsysProcess *pcVar1;
  int local_2c;
  rep_conflict local_28 [3];
  cmCTestRunProcess *local_10;
  cmCTestRunProcess *this_local;
  
  local_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->CommandLineStrings);
  std::__cxx11::string::string((string *)&this->WorkingDirectory);
  pcVar1 = cmsysProcess_New();
  this->Process = pcVar1;
  this->PipeState = -1;
  local_2c = -1;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<int,void>
            ((duration<double,std::ratio<1l,1l>> *)local_28,&local_2c);
  (this->TimeOut).__r = local_28[0];
  return;
}

Assistant:

cmCTestRunProcess()
  {
    this->Process = cmsysProcess_New();
    this->PipeState = -1;
    this->TimeOut = cmDuration(-1);
  }